

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileWatcherSync.hpp
# Opt level: O1

void __thiscall wmj::fileWatcherSync::~fileWatcherSync(fileWatcherSync *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color wd;
  _Base_ptr p_Var2;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pair;
  long *local_48 [2];
  long local_38 [2];
  
  p_Var2 = (this->wd_to_file_name)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->wd_to_file_name)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var1) {
    do {
      wd = p_Var2[1]._M_color;
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_48,p_Var2[1]._M_parent,
                 (long)&(p_Var2[1]._M_parent)->_M_color + (long)&(p_Var2[1]._M_left)->_M_color);
      remove_wd(this,wd);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var1);
  }
  close(this->inotify_fd);
  this->inotify_fd = 0;
  if ((this->watch_thread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if ((this->watch_thread)._M_id._M_thread == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&this->change_file_list);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&(this->wd_to_file_name)._M_t);
    return;
  }
  std::terminate();
}

Assistant:

~fileWatcherSync() {
        for(auto pair : this->wd_to_file_name) {
            remove_wd(pair.first);
        }
        close(inotify_fd);
        // 停止文件监视线程
        inotify_fd = 0;
        if(watch_thread.joinable()) {
            watch_thread.join();
        }
    }